

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O0

aiMaterial * __thiscall
Assimp::MMDImporter::CreateMaterial(MMDImporter *this,PmxMaterial *pMat,PmxModel *pModel)

{
  aiMaterial *this_00;
  type pString;
  int local_86c;
  undefined1 local_868 [4];
  int mapping_uvwsrc;
  aiString texture_path;
  float shininess;
  float opacity;
  aiColor3D ambient;
  aiColor3D specular;
  aiColor3D diffuse;
  aiString name;
  aiMaterial *mat;
  PmxModel *pModel_local;
  PmxMaterial *pMat_local;
  MMDImporter *this_local;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  aiString::aiString((aiString *)&diffuse.g,&pMat->material_english_name);
  aiMaterial::AddProperty(this_00,(aiString *)&diffuse.g,"?mat.name",0,0);
  aiColor3D::aiColor3D((aiColor3D *)&specular.g,pMat->diffuse[0],pMat->diffuse[1],pMat->diffuse[2]);
  aiMaterial::AddProperty(this_00,(aiColor3D *)&specular.g,1,"$clr.diffuse",0,0);
  aiColor3D::aiColor3D
            ((aiColor3D *)&ambient.g,pMat->specular[0],pMat->specular[1],pMat->specular[2]);
  aiMaterial::AddProperty(this_00,(aiColor3D *)&ambient.g,1,"$clr.specular",0,0);
  aiColor3D::aiColor3D((aiColor3D *)&shininess,pMat->ambient[0],pMat->ambient[1],pMat->ambient[2]);
  aiMaterial::AddProperty(this_00,(aiColor3D *)&shininess,1,"$clr.ambient",0,0);
  texture_path.data._1020_4_ = pMat->diffuse[3];
  aiMaterial::AddProperty(this_00,(float *)(texture_path.data + 0x3fc),1,"$mat.opacity",0,0);
  texture_path.data._1016_4_ = pMat->specularlity;
  aiMaterial::AddProperty(this_00,(float *)(texture_path.data + 0x3f8),1,"$mat.shinpercent",0,0);
  if (-1 < pMat->diffuse_texture_index) {
    pString = std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[],_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
              ::operator[](&pModel->textures,(long)pMat->diffuse_texture_index);
    aiString::aiString((aiString *)local_868,pString);
    aiMaterial::AddProperty(this_00,(aiString *)local_868,"$tex.file",1,0);
  }
  local_86c = 0;
  aiMaterial::AddProperty(this_00,&local_86c,1,"$tex.uvwsrc",1,0);
  return this_00;
}

Assistant:

aiMaterial *MMDImporter::CreateMaterial(const pmx::PmxMaterial *pMat,
                                        const pmx::PmxModel *pModel) {
  aiMaterial *mat = new aiMaterial();
  aiString name(pMat->material_english_name);
  mat->AddProperty(&name, AI_MATKEY_NAME);

  aiColor3D diffuse(pMat->diffuse[0], pMat->diffuse[1], pMat->diffuse[2]);
  mat->AddProperty(&diffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
  aiColor3D specular(pMat->specular[0], pMat->specular[1], pMat->specular[2]);
  mat->AddProperty(&specular, 1, AI_MATKEY_COLOR_SPECULAR);
  aiColor3D ambient(pMat->ambient[0], pMat->ambient[1], pMat->ambient[2]);
  mat->AddProperty(&ambient, 1, AI_MATKEY_COLOR_AMBIENT);

  float opacity = pMat->diffuse[3];
  mat->AddProperty(&opacity, 1, AI_MATKEY_OPACITY);
  float shininess = pMat->specularlity;
  mat->AddProperty(&shininess, 1, AI_MATKEY_SHININESS_STRENGTH);

  if(pMat->diffuse_texture_index >= 0) {
      aiString texture_path(pModel->textures[pMat->diffuse_texture_index]);
      mat->AddProperty(&texture_path, AI_MATKEY_TEXTURE(aiTextureType_DIFFUSE, 0));
  }

  int mapping_uvwsrc = 0;
  mat->AddProperty(&mapping_uvwsrc, 1,
                   AI_MATKEY_UVWSRC(aiTextureType_DIFFUSE, 0));

  return mat;
}